

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitXorOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  ulong *puVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  ulong uVar15;
  ulong uVar16;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      lVar3 = *(long *)(input + 0x20);
      lVar4 = *(long *)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      lVar6 = *(long *)(input + 0x28);
      if (lVar6 == 0) {
        if (count == 0) {
          return;
        }
        iVar12 = 0;
        do {
          pcVar5 = *(char **)(lVar4 + iVar12 * 8);
          uVar9 = *(ulong *)(lVar3 + iVar12 * 8);
          if (*pcVar5 == '\0') {
            *pcVar5 = '\x01';
          }
          else {
            uVar9 = uVar9 ^ *(ulong *)(pcVar5 + 8);
          }
          *(ulong *)(pcVar5 + 8) = uVar9;
          iVar12 = iVar12 + 1;
        } while (count != iVar12);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar8 = 0;
      uVar9 = 0;
      do {
        uVar15 = *(ulong *)(lVar6 + uVar8 * 8);
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
        uVar11 = uVar10;
        if (uVar15 != 0) {
          uVar11 = uVar9;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar9 < uVar10) {
              do {
                pcVar5 = *(char **)(lVar4 + uVar9 * 8);
                uVar15 = *(ulong *)(lVar3 + uVar9 * 8);
                if (*pcVar5 == '\0') {
                  *pcVar5 = '\x01';
                }
                else {
                  uVar15 = uVar15 ^ *(ulong *)(pcVar5 + 8);
                }
                *(ulong *)(pcVar5 + 8) = uVar15;
                uVar9 = uVar9 + 1;
                uVar11 = uVar10;
              } while (uVar10 != uVar9);
            }
          }
          else if (uVar9 < uVar10) {
            uVar16 = 0;
            do {
              if ((uVar15 >> (uVar16 & 0x3f) & 1) != 0) {
                pcVar5 = *(char **)(lVar4 + uVar9 * 8 + uVar16 * 8);
                uVar11 = *(ulong *)(lVar3 + uVar9 * 8 + uVar16 * 8);
                if (*pcVar5 == '\0') {
                  *(ulong *)(pcVar5 + 8) = uVar11;
                  *pcVar5 = '\x01';
                }
                else {
                  *(ulong *)(pcVar5 + 8) = *(ulong *)(pcVar5 + 8) ^ uVar11;
                }
              }
              uVar16 = uVar16 + 1;
              uVar11 = uVar10;
            } while (uVar10 - uVar9 != uVar16);
          }
        }
        uVar8 = uVar8 + 1;
        uVar9 = uVar11;
      } while (uVar8 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    if (count == 0) {
      return;
    }
    puVar1 = *(ulong **)(input + 0x20);
    pbVar2 = (byte *)**(undefined8 **)(states + 0x20);
    bVar7 = *pbVar2;
    do {
      uVar9 = *puVar1;
      if ((bVar7 & 1) == 0) {
        *pbVar2 = 1;
        bVar7 = 1;
      }
      else {
        uVar9 = uVar9 ^ *(ulong *)(pbVar2 + 8);
      }
      *(ulong *)(pbVar2 + 8) = uVar9;
      count = count - 1;
    } while (count != 0);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_a8 == 0) {
    if (count != 0) {
      lVar3 = *local_b8;
      lVar4 = *local_70;
      iVar12 = 0;
      do {
        iVar13 = iVar12;
        if (lVar3 != 0) {
          iVar13 = (idx_t)*(uint *)(lVar3 + iVar12 * 4);
        }
        iVar14 = iVar12;
        if (lVar4 != 0) {
          iVar14 = (idx_t)*(uint *)(lVar4 + iVar12 * 4);
        }
        pcVar5 = *(char **)(local_68 + iVar14 * 8);
        uVar9 = *(ulong *)(local_b0 + iVar13 * 8);
        if (*pcVar5 == '\0') {
          *pcVar5 = '\x01';
        }
        else {
          uVar9 = uVar9 ^ *(ulong *)(pcVar5 + 8);
        }
        *(ulong *)(pcVar5 + 8) = uVar9;
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
  }
  else if (count != 0) {
    lVar3 = *local_b8;
    lVar4 = *local_70;
    iVar12 = 0;
    do {
      iVar13 = iVar12;
      if (lVar3 != 0) {
        iVar13 = (idx_t)*(uint *)(lVar3 + iVar12 * 4);
      }
      iVar14 = iVar12;
      if (lVar4 != 0) {
        iVar14 = (idx_t)*(uint *)(lVar4 + iVar12 * 4);
      }
      if ((*(ulong *)(local_a8 + (iVar13 >> 6) * 8) >> (iVar13 & 0x3f) & 1) != 0) {
        pcVar5 = *(char **)(local_68 + iVar14 * 8);
        uVar9 = *(ulong *)(local_b0 + iVar13 * 8);
        if (*pcVar5 == '\0') {
          *(ulong *)(pcVar5 + 8) = uVar9;
          *pcVar5 = '\x01';
        }
        else {
          *(ulong *)(pcVar5 + 8) = *(ulong *)(pcVar5 + 8) ^ uVar9;
        }
      }
      iVar12 = iVar12 + 1;
    } while (count != iVar12);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}